

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strength_reduction_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::StrengthReductionPass::FindIntTypesAndConstants(StrengthReductionPass *this)

{
  IRContext *pIVar1;
  Module *pMVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Instruction *this_00;
  Integer uint32;
  Integer int32;
  Type local_90;
  undefined1 local_68;
  Type local_60;
  undefined1 local_38;
  
  local_60.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.kind_ = kInteger;
  local_60._36_4_ = 0x20;
  local_60._vptr_Type = (_func_int **)&PTR__Type_003db8d0;
  local_38 = 1;
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  uVar3 = analysis::TypeManager::GetId
                    ((pIVar1->type_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                     _M_head_impl,&local_60);
  *(uint32_t *)&(this->super_Pass).field_0x34 = uVar3;
  local_90.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.kind_ = kInteger;
  local_90._36_4_ = 0x20;
  local_90._vptr_Type = (_func_int **)&PTR__Type_003db8d0;
  local_68 = 0;
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  uVar3 = analysis::TypeManager::GetId
                    ((pIVar1->type_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                     _M_head_impl,&local_90);
  this->uint32_type_id_ = uVar3;
  pMVar2 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  this_00 = *(Instruction **)
             ((long)&(pMVar2->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  if (this_00 !=
      (Instruction *)
      ((long)&(pMVar2->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    do {
      if (this_00->opcode_ == OpConstant) {
        uVar3 = 0;
        if (this_00->has_type_id_ == true) {
          uVar3 = Instruction::GetSingleWordOperand(this_00,0);
        }
        if ((uVar3 == this->uint32_type_id_) &&
           (uVar3 = Instruction::GetSingleWordOperand(this_00,2), uVar3 < 0x21)) {
          uVar4 = 0;
          if (this_00->has_result_id_ == true) {
            uVar4 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
          }
          this->constant_ids_[uVar3] = uVar4;
        }
      }
      this_00 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (this_00 !=
             (Instruction *)
             ((long)&(((((this->super_Pass).context_)->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                     types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8U));
  }
  local_90._vptr_Type = (_func_int **)&PTR__Type_003d7f68;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_90.decorations_);
  local_60._vptr_Type = (_func_int **)&PTR__Type_003d7f68;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_60.decorations_);
  return;
}

Assistant:

void StrengthReductionPass::FindIntTypesAndConstants() {
  analysis::Integer int32(32, true);
  int32_type_id_ = context()->get_type_mgr()->GetId(&int32);
  analysis::Integer uint32(32, false);
  uint32_type_id_ = context()->get_type_mgr()->GetId(&uint32);
  for (auto iter = get_module()->types_values_begin();
       iter != get_module()->types_values_end(); ++iter) {
    switch (iter->opcode()) {
      case spv::Op::OpConstant:
        if (iter->type_id() == uint32_type_id_) {
          uint32_t value = iter->GetSingleWordOperand(2);
          if (value <= 32) constant_ids_[value] = iter->result_id();
        }
        break;
      default:
        break;
    }
  }
}